

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::on_remove_peers(torrent *this)

{
  session_interface *psVar1;
  bool bVar2;
  element_type *peVar3;
  pause_flags_t local_31;
  __shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *local_30;
  shared_ptr<libtorrent::aux::peer_connection> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  *__range2;
  torrent *this_local;
  
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
           ::begin(&this->m_peers_to_disconnect);
  p = (shared_ptr<libtorrent::aux::peer_connection> *)
      ::std::
      vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
      ::end(&this->m_peers_to_disconnect);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::peer_connection>_*,_std::vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>_>
                                     *)&p), bVar2) {
    local_30 = &__gnu_cxx::
                __normal_iterator<std::shared_ptr<libtorrent::aux::peer_connection>_*,_std::vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>_>
                ::operator*(&__end2)->
                super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>;
    peVar3 = ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::get
                       (local_30);
    remove_connection(this,peVar3);
    psVar1 = (this->super_torrent_hot_members).m_ses;
    peVar3 = ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::get
                       (local_30);
    (*(psVar1->super_session_logger)._vptr_session_logger[0x1d])(psVar1,peVar3);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::aux::peer_connection>_*,_std::vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>_>
    ::operator++(&__end2);
  }
  ::std::
  vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::clear(&this->m_peers_to_disconnect);
  if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1f & 1) != 0) &&
     (bVar2 = ::std::
              vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ::empty(&(this->super_torrent_hot_members).m_connections.
                       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ), bVar2)) {
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
    bitfield_flag(&local_31);
    set_paused(this,true,local_31);
  }
  update_want_peers(this);
  update_want_tick(this);
  return;
}

Assistant:

void torrent::on_remove_peers() noexcept
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

#if TORRENT_USE_ASSERTS
		auto const num = m_peers_to_disconnect.size();
#endif
		for (auto const& p : m_peers_to_disconnect)
		{
			TORRENT_ASSERT(p);
			TORRENT_ASSERT(p->associated_torrent().lock().get() == this);

			remove_connection(p.get());
			m_ses.close_connection(p.get());
		}
		TORRENT_ASSERT_VAL(m_peers_to_disconnect.size() == num, m_peers_to_disconnect.size() - num);
		m_peers_to_disconnect.clear();

		if (m_graceful_pause_mode && m_connections.empty())
		{
			// we're in graceful pause mode and this was the last peer we
			// disconnected. This will clear the graceful_pause_mode and post the
			// torrent_paused_alert.
			TORRENT_ASSERT(is_paused());

			// this will post torrent_paused alert
			set_paused(true);
		}

		update_want_peers();
		update_want_tick();
	}